

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

int Omega_h::step(FiniteAutomaton *fa,int state,int symbol)

{
  int iVar1;
  ConstRef pvVar2;
  int symbol_local;
  int state_local;
  FiniteAutomaton *fa_local;
  
  if (state < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= state",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x47);
  }
  iVar1 = get_nstates(fa);
  if (iVar1 <= state) {
    fail("assertion %s failed at %s +%d\n","state < get_nstates(fa)",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x48);
  }
  if (symbol < 0) {
    fail("assertion %s failed at %s +%d\n","0 <= symbol",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
         ,0x49);
  }
  iVar1 = get_ncols<int>(&fa->table);
  if (symbol < iVar1) {
    pvVar2 = at<int>(&fa->table,state,symbol);
    return *pvVar2;
  }
  fail("assertion %s failed at %s +%d\n","symbol < get_ncols(fa.table)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_finite_automaton.cpp"
       ,0x4b);
}

Assistant:

int step(FiniteAutomaton const& fa, int state, int symbol) {
  OMEGA_H_CHECK(0 <= state);
  OMEGA_H_CHECK(state < get_nstates(fa));
  OMEGA_H_CHECK(0 <= symbol);
  OMEGA_H_CHECK(
      symbol < get_ncols(fa.table));  // allow getting epsilon transitions
  return at(fa.table, state, symbol);
}